

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ocl::getProgramBinaries
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cl_program program)

{
  cl_int cVar1;
  allocator local_81;
  string local_80;
  uchar *local_60;
  uchar *data;
  allocator local_41;
  string local_40;
  size_type local_20;
  size_t binaries_size;
  cl_program program_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *binaries;
  
  binaries_size = (size_t)program;
  program_local = (cl_program)__return_storage_ptr__;
  cVar1 = clGetProgramInfo(program,0x1165,8,&local_20,(size_t *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  reportError(cVar1,0x1e6,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  data._3_1_ = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&data + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,local_20,(allocator<unsigned_char> *)((long)&data + 2));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&data + 2));
  local_60 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (__return_storage_ptr__);
  cVar1 = clGetProgramInfo((cl_program)binaries_size,0x1166,8,&local_60,(size_t *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"",&local_81);
  reportError(cVar1,0x1eb,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> getProgramBinaries(cl_program program)
	{
		size_t binaries_size;
		OCL_SAFE_CALL(clGetProgramInfo(program, CL_PROGRAM_BINARY_SIZES,
									   sizeof(size_t), &binaries_size, NULL));

		std::vector<unsigned char> binaries(binaries_size);
		unsigned char *data = binaries.data();
		OCL_SAFE_CALL(clGetProgramInfo(program, CL_PROGRAM_BINARIES,
									   sizeof(unsigned char *), &data, NULL));

		return binaries;
	}